

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  undefined4 uVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int *__s;
  Vec_Ptr_t *pVVar9;
  void **__s_00;
  int iVar10;
  void **extraout_RDX;
  void **extraout_RDX_00;
  void **extraout_RDX_01;
  void **ppvVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long *plVar17;
  
  iVar7 = Abc_NtkLevel(pNtk);
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar10 = pNtk->vObjs->nSize;
    uVar13 = (long)iVar10 + 500;
    iVar16 = (int)uVar13;
    if ((pNtk->vTravIds).nCap < iVar16) {
      __s = (int *)malloc(uVar13 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar16;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar10) {
      memset(__s,0,(uVar13 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar16;
  }
  iVar10 = pNtk->nTravIds;
  pNtk->nTravIds = iVar10 + 1;
  if (0x3ffffffe < iVar10) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  iVar16 = iVar7 + 2;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  iVar10 = 8;
  if (6 < iVar7 + 1U) {
    iVar10 = iVar16;
  }
  pVVar9->nCap = iVar10;
  if (iVar10 == 0) {
    __s_00 = (void **)0x0;
  }
  else {
    __s_00 = (void **)malloc((long)iVar10 << 3);
  }
  pVVar9->pArray = __s_00;
  pVVar9->nSize = iVar16;
  memset(__s_00,0,(long)iVar16 << 3);
  ppvVar11 = extraout_RDX;
  if (0 < nNodes) {
    uVar13 = 0;
    do {
      pAVar2 = ppNodes[uVar13];
      uVar8 = *(uint *)&pAVar2->field_0x14 & 0xf;
      if ((uVar8 != 2) && (uVar8 != 5)) {
        __assert_fail("Abc_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                      ,0x157,
                      "Vec_Ptr_t *Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *, Abc_Obj_t **, int)");
      }
      pAVar3 = pAVar2->pNtk;
      iVar10 = pAVar2->Id;
      iVar12 = pAVar3->nTravIds;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar10 + 1,(int)ppvVar11);
      if (((long)iVar10 < 0) || ((pAVar3->vTravIds).nSize <= iVar10)) {
LAB_008445dd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar3->vTravIds).pArray[iVar10] = iVar12;
      if (0xfff < *(uint *)&pAVar2->field_0x14) {
        __assert_fail("pObj->Level == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                      ,0x15a,
                      "Vec_Ptr_t *Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *, Abc_Obj_t **, int)");
      }
      if (iVar7 < -1) {
LAB_008445fc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      (pAVar2->field_6).pCopy = (Abc_Obj_t *)*__s_00;
      *__s_00 = pAVar2;
      uVar13 = uVar13 + 1;
      ppvVar11 = extraout_RDX_00;
    } while ((uint)nNodes != uVar13);
  }
  if (-1 < iVar7) {
    uVar13 = 0;
    do {
      for (plVar17 = (long *)__s_00[uVar13]; plVar17 != (long *)0x0; plVar17 = (long *)plVar17[8]) {
        if (0 < *(int *)((long)plVar17 + 0x2c)) {
          lVar15 = 0;
          do {
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar17 + 0x20) + 8) +
                               (long)*(int *)(plVar17[6] + lVar15 * 4) * 8);
            lVar14 = *plVar4;
            iVar10 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar14 + 0xe0),iVar10 + 1,(int)ppvVar11);
            if (((long)iVar10 < 0) || (*(int *)(lVar14 + 0xe4) <= iVar10)) {
LAB_008445be:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            ppvVar11 = extraout_RDX_01;
            if (*(int *)(*(long *)(lVar14 + 0xe8) + (long)iVar10 * 4) != *(int *)(*plVar4 + 0xd8)) {
              iVar10 = *(int *)((long)plVar4 + 0x1c);
              lVar14 = 0;
              iVar12 = 0;
              ppvVar11 = extraout_RDX_01;
              if (0 < iVar10) {
                do {
                  plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                     (long)*(int *)(plVar4[4] + lVar14 * 4) * 8);
                  lVar6 = *plVar5;
                  iVar12 = (int)plVar5[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar12 + 1,(int)ppvVar11);
                  if (((long)iVar12 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar12)) goto LAB_008445be;
                  ppvVar11 = (void **)*plVar5;
                  iVar10 = *(int *)((long)plVar4 + 0x1c);
                } while ((*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar12 * 4) ==
                          *(int *)(ppvVar11 + 0x1b)) && (lVar14 = lVar14 + 1, lVar14 < iVar10));
                iVar12 = (int)lVar14;
              }
              if (iVar10 <= iVar12) {
                lVar14 = *plVar4;
                iVar10 = (int)plVar4[2];
                uVar1 = *(undefined4 *)(lVar14 + 0xd8);
                Vec_IntFillExtra((Vec_Int_t *)(lVar14 + 0xe0),iVar10 + 1,(int)ppvVar11);
                if (((long)iVar10 < 0) || (*(int *)(lVar14 + 0xe4) <= iVar10)) goto LAB_008445dd;
                *(undefined4 *)(*(long *)(lVar14 + 0xe8) + (long)iVar10 * 4) = uVar1;
                uVar8 = *(uint *)((long)plVar4 + 0x14);
                if (0xfffffffd < (uVar8 & 0xf) - 5) {
                  uVar8 = uVar8 & 0xfff | iVar7 * 0x1000 + 0x1000U;
                  *(uint *)((long)plVar4 + 0x14) = uVar8;
                }
                uVar8 = uVar8 >> 0xc;
                if (iVar16 <= (int)uVar8) goto LAB_008445fc;
                plVar4[8] = (long)__s_00[uVar8];
                __s_00[uVar8] = plVar4;
                ppvVar11 = __s_00;
                if (0xfffffffd < (*(uint *)((long)plVar4 + 0x14) & 0xf) - 5) {
                  *(uint *)((long)plVar4 + 0x14) = *(uint *)((long)plVar4 + 0x14) & 0xfff;
                }
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)((long)plVar17 + 0x2c));
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != iVar7 + 1U);
  }
  return pVVar9;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverseNodesContained( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout, * pFanin;
    int i, k, m, nLevels;
    // set the levels
    nLevels = Abc_NtkLevel( pNtk );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrStart( nLevels + 2 );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = ppNodes[i];
        assert( Abc_ObjIsCi(pObj) );
        Abc_NodeSetTravIdCurrent( pObj );
        // add to the array
        assert( pObj->Level == 0 );
        pObj->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pObj->Level );
        Vec_PtrWriteEntry( vNodes, pObj->Level, pObj );
    }
    // iterate through the levels
    for ( i = 0; i <= nLevels; i++ )
    {
        // iterate through the nodes on each level
        for ( pObj = (Abc_Obj_t *)Vec_PtrEntry(vNodes, i); pObj; pObj = pObj->pCopy )
        {
            // iterate through the fanouts of each node
            Abc_ObjForEachFanout( pObj, pFanout, k )
            {
                // skip visited nodes
                if ( Abc_NodeIsTravIdCurrent(pFanout) )
                    continue;
                // visit the fanins of this fanout
                Abc_ObjForEachFanin( pFanout, pFanin, m )
                {
                    if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                        break;
                }
                if ( m < Abc_ObjFaninNum(pFanout) )
                    continue;
                // all fanins are already collected

                // mark the node as visited
                Abc_NodeSetTravIdCurrent( pFanout );
                // handle the COs
                if ( Abc_ObjIsCo(pFanout) )
                    pFanout->Level = nLevels + 1;
                // add to the array
                pFanout->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pFanout->Level );
                Vec_PtrWriteEntry( vNodes, pFanout->Level, pFanout );
                // handle the COs
                if ( Abc_ObjIsCo(pFanout) )
                    pFanout->Level = 0;
            }
        }
    }
    return vNodes;
}